

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

void __thiscall
bgui::ImageAdapter<float>::getPixel
          (ImageAdapter<float> *this,double *r,double *g,double *b,float x,float y,int ir,int ig,
          int ib)

{
  double dVar1;
  pointer pIVar2;
  float ***pppfVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  Image<float,_gimage::PixelTraits<float>_> *this_00;
  int iVar10;
  float fVar11;
  work_t wVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = (long)x;
    lVar9 = (long)y;
    pppfVar3 = this->image->img;
    *r = (double)pppfVar3[ir][lVar9][lVar6];
    *g = (double)pppfVar3[ig][lVar9][lVar6];
    dVar13 = (double)pppfVar3[ib][lVar9][lVar6];
  }
  else {
    dVar13 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar4 = (int)(dVar13 / 0.6931471805599453) - 1;
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 3) *
            -0x49249249 - 1;
    if ((int)uVar4 < (int)uVar8) {
      uVar8 = uVar4;
    }
    iVar7 = uVar8 + 1;
    iVar10 = 1 << ((byte)iVar7 & 0x1f);
    if ((int)uVar8 < 0) {
      wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ir);
      *r = (double)wVar12;
      wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ig);
      *g = (double)wVar12;
      this_00 = this->image;
      fVar15 = y;
      fVar11 = x;
    }
    else {
      fVar15 = (float)iVar10;
      fVar11 = x / fVar15;
      fVar15 = y / fVar15;
      wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         (pIVar2 + uVar8,fVar11,fVar15,ir);
      *r = (double)wVar12;
      wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         ((this->mipmap).
                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar8,fVar11,fVar15,ig);
      *g = (double)wVar12;
      this_00 = (this->mipmap).
                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar8;
    }
    wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       (this_00,fVar11,fVar15,ib);
    *b = (double)wVar12;
    if ((int)uVar8 < -1) {
      return;
    }
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 3);
    if (SBORROW4(iVar7,iVar5 * -0x49249249) == iVar7 + iVar5 * 0x49249249 < 0) {
      return;
    }
    dVar13 = (double)iVar10;
    dVar13 = (1.0 / (this->super_ImageAdapterBase).scale - dVar13) / dVar13;
    if (dVar13 <= 1e-06) {
      return;
    }
    dVar14 = 1.0 - dVar13;
    fVar11 = (float)(2 << ((byte)iVar7 & 0x1f));
    fVar15 = x / fVar11;
    fVar11 = y / fVar11;
    dVar1 = *r;
    wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       (pIVar2 + iVar7,fVar15,fVar11,ir);
    *r = (double)wVar12 * dVar13 + dVar1 * dVar14;
    dVar1 = *g;
    wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       ((this->mipmap).
                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar7,fVar15,fVar11,ig);
    *g = (double)wVar12 * dVar13 + dVar1 * dVar14;
    dVar1 = *b;
    wVar12 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       ((this->mipmap).
                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar7,fVar15,fVar11,ib);
    dVar13 = (double)wVar12 * dVar13 + dVar14 * dVar1;
  }
  *b = dVar13;
  return;
}

Assistant:

void getPixel(double &r, double &g, double &b, float x, float y,
                  int ir, int ig, int ib) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);

        if (j < 0)
        {
          r=image->getBilinear(x, y, ir);
          g=image->getBilinear(x, y, ig);
          b=image->getBilinear(x, y, ib);
        }
        else
        {
          r=mipmap[j].getBilinear(x/ds, y/ds, ir);
          g=mipmap[j].getBilinear(x/ds, y/ds, ig);
          b=mipmap[j].getBilinear(x/ds, y/ds, ib);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            r=(1-f)*r+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ir);
            g=(1-f)*g+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ig);
            b=(1-f)*b+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ib);
          }
        }

        return;
      }

      r=image->get(static_cast<long>(x), static_cast<long>(y), ir);
      g=image->get(static_cast<long>(x), static_cast<long>(y), ig);
      b=image->get(static_cast<long>(x), static_cast<long>(y), ib);
    }